

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O0

int parse_matrix_parameters(char **begin,char *end,float *values,int required,int optional)

{
  _Bool _Var1;
  _Bool local_39;
  int local_38;
  int iStack_34;
  _Bool has_trailing_comma;
  int max_count;
  int count;
  int optional_local;
  int required_local;
  float *values_local;
  char *end_local;
  char **begin_local;
  
  max_count = optional;
  count = required;
  _optional_local = values;
  values_local = (float *)end;
  end_local = (char *)begin;
  _Var1 = plutovg_skip_ws_and_delim(begin,end,'(');
  if (_Var1) {
    iStack_34 = 0;
    local_38 = count + max_count;
    local_39 = false;
    while ((iStack_34 < local_38 &&
           (_Var1 = plutovg_parse_number
                              ((char **)end_local,(char *)values_local,_optional_local + iStack_34),
           _Var1))) {
      plutovg_skip_ws_or_comma((char **)end_local,(char *)values_local,&local_39);
      iStack_34 = iStack_34 + 1;
    }
    if (((local_39 & 1U) == 0) &&
       (((iStack_34 == count || (iStack_34 == local_38)) &&
        (_Var1 = plutovg_skip_delim((char **)end_local,(char *)values_local,')'), _Var1)))) {
      begin_local._4_4_ = iStack_34;
    }
    else {
      begin_local._4_4_ = 0;
    }
  }
  else {
    begin_local._4_4_ = 0;
  }
  return begin_local._4_4_;
}

Assistant:

static int parse_matrix_parameters(const char** begin, const char* end, float values[6], int required, int optional)
{
    if(!plutovg_skip_ws_and_delim(begin, end, '('))
        return 0;
    int count = 0;
    int max_count = required + optional;
    bool has_trailing_comma = false;
    for(; count < max_count; ++count) {
        if(!plutovg_parse_number(begin, end, values + count))
            break;
        plutovg_skip_ws_or_comma(begin, end, &has_trailing_comma);
    }

    if(!has_trailing_comma && (count == required || count == max_count)
        && plutovg_skip_delim(begin, end, ')')) {
        return count;
    }

    return 0;
}